

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O1

bool __thiscall Regex::processTerminal(Regex *this,Element *cur_node,ParseData *data)

{
  char cVar1;
  pointer pcVar2;
  char cVar3;
  Element *pEVar4;
  
  if (cur_node->mType == TYPE_CLASS) {
    cVar3 = cur_node->mClassInvert;
    pEVar4 = cur_node->mChild;
    if (pEVar4 != (Element *)0x0) {
      pcVar2 = (data->string)._M_dataplus._M_p;
      do {
        if ((bool)cVar3 == false) {
          cVar1 = pcVar2[data->cur_pos];
          if ((pEVar4->mTermStartChar <= cVar1) && (cVar1 <= pEVar4->mTermEndChar)) {
            return true;
          }
        }
        else {
          cVar1 = pcVar2[data->cur_pos];
          if ((pEVar4->mTermStartChar <= cVar1) && (cVar1 <= pEVar4->mTermEndChar))
          goto LAB_0011d8c9;
        }
        pEVar4 = pEVar4->mNext;
      } while (pEVar4 != (Element *)0x0);
    }
  }
  else if (((cur_node->mType != TYPE_TERMINAL) ||
           (cVar1 = (data->string)._M_dataplus._M_p[data->cur_pos], cVar1 < cur_node->mTermStartChar
           )) || (cVar3 = '\x01', cur_node->mTermEndChar < cVar1)) {
LAB_0011d8c9:
    cVar3 = '\0';
  }
  return (bool)cVar3;
}

Assistant:

bool	Regex::processTerminal( Element *cur_node, ParseData *data )
{
	if ( cur_node->mType == TYPE_TERMINAL )
	{
		if ( CUR_CHAR >= cur_node->mTermStartChar && CUR_CHAR <= cur_node->mTermEndChar )
			return true;
	}
	else if ( cur_node->mType == TYPE_CLASS )
	{
		bool invert = cur_node->mClassInvert;
		bool match = invert;
		Element *child_node = cur_node->mChild;
		
		while ( child_node != NULL )
		{
			if ( !invert )
			{
				if ( CUR_CHAR >= child_node->mTermStartChar && CUR_CHAR <= child_node->mTermEndChar )
					return true;
			}
			else
			{
				if ( CUR_CHAR >= child_node->mTermStartChar && CUR_CHAR <= child_node->mTermEndChar )
					return false;
			}
			
			child_node = child_node->mNext;
		}
		
		if ( match )
			return true;
		else
			return false;
	}

	return false;
}